

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void * drmp3_malloc(size_t sz,drmp3_allocation_callbacks *pAllocationCallbacks)

{
  drmp3_allocation_callbacks *pAllocationCallbacks_local;
  size_t sz_local;
  
  if (pAllocationCallbacks == (drmp3_allocation_callbacks *)0x0) {
    sz_local = (size_t)drmp3__malloc_default(sz,(void *)0x0);
  }
  else {
    sz_local = (size_t)drmp3__malloc_from_callbacks(sz,pAllocationCallbacks);
  }
  return (void *)sz_local;
}

Assistant:

DRMP3_API void* drmp3_malloc(size_t sz, const drmp3_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks != NULL) {
        return drmp3__malloc_from_callbacks(sz, pAllocationCallbacks);
    } else {
        return drmp3__malloc_default(sz, NULL);
    }
}